

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

Color __thiscall Color::subtract(Color *this,uint8_t value)

{
  int local_28;
  int local_24;
  int32_t b;
  int32_t g;
  int32_t r;
  uint8_t value_local;
  Color *this_local;
  
  b = (uint)this->_r - (uint)value;
  if (b < 0) {
    b = 0;
  }
  local_24 = (uint)this->_g - (uint)value;
  if (local_24 < 0) {
    local_24 = 0;
  }
  local_28 = (uint)this->_b - (uint)value;
  if (local_28 < 0) {
    local_28 = 0;
  }
  Color((Color *)((long)&this_local + 4),(uint8_t)b,(uint8_t)local_24,(uint8_t)local_28);
  return this_local._4_4_;
}

Assistant:

Color Color::subtract(uint8_t value) const
{
    int32_t r = _r - value;
    if(r < 0)
        r = 0;

    int32_t g = _g - value;
    if(g < 0)
        g = 0;

    int32_t b = _b - value;
    if(b < 0)
        b = 0;

    return { (uint8_t)r, (uint8_t)g, (uint8_t)b };
}